

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

void borg_prepare_book_info(void)

{
  int local_c;
  int spell;
  
  switch(player->class->cidx) {
  case 1:
    borg_spell_ratings = borg_spell_ratings_MAGE;
    break;
  case 2:
    borg_spell_ratings = borg_spell_ratings_DRUID;
    break;
  case 3:
    borg_spell_ratings = borg_spell_ratings_PRIEST;
    break;
  case 4:
    borg_spell_ratings = borg_spell_ratings_NECROMANCER;
    break;
  case 5:
    borg_spell_ratings = borg_spell_ratings_PALADIN;
    break;
  case 6:
    borg_spell_ratings = borg_spell_ratings_ROGUE;
    break;
  case 7:
    borg_spell_ratings = borg_spell_ratings_RANGER;
    break;
  case 8:
    borg_spell_ratings = borg_spell_ratings_BLACKGUARD;
    break;
  default:
    borg_spell_ratings = (borg_spell_rating *)0x0;
    return;
  }
  if (borg_magics != (borg_magic *)0x0) {
    mem_free(borg_magics);
  }
  borg_magics = (borg_magic *)mem_zalloc((long)(player->class->magic).total_spells << 5);
  for (local_c = 0; local_c < (player->class->magic).total_spells; local_c = local_c + 1) {
    borg_init_spell(borg_magics,local_c);
  }
  return;
}

Assistant:

void borg_prepare_book_info(void)
{
    switch (player->class->cidx) {
    case CLASS_MAGE:
        borg_spell_ratings = borg_spell_ratings_MAGE;
        break;
    case CLASS_DRUID:
        borg_spell_ratings = borg_spell_ratings_DRUID;
        break;
    case CLASS_PRIEST:
        borg_spell_ratings = borg_spell_ratings_PRIEST;
        break;
    case CLASS_NECROMANCER:
        borg_spell_ratings = borg_spell_ratings_NECROMANCER;
        break;
    case CLASS_PALADIN:
        borg_spell_ratings = borg_spell_ratings_PALADIN;
        break;
    case CLASS_ROGUE:
        borg_spell_ratings = borg_spell_ratings_ROGUE;
        break;
    case CLASS_RANGER:
        borg_spell_ratings = borg_spell_ratings_RANGER;
        break;
    case CLASS_BLACKGUARD:
        borg_spell_ratings = borg_spell_ratings_BLACKGUARD;
        break;
    default:
        borg_spell_ratings = NULL;
        return;
    }

    if (borg_magics)
        mem_free(borg_magics);

    borg_magics
        = mem_zalloc(player->class->magic.total_spells * sizeof(borg_magic));

    for (int spell = 0; spell < player->class->magic.total_spells; spell++) {
        borg_init_spell(borg_magics, spell);
    }
}